

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::FormulasLoader15::begin__gcd
          (FormulasLoader15 *this,gcd__AttributeData *attributeData)

{
  long *plVar1;
  byte bVar2;
  uint *in_RSI;
  gcd__AttributeData *in_RDI;
  gcd__AttributeData attrData;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  uint local_228 [2];
  gcd__AttributeData *in_stack_fffffffffffffde0;
  
  gcd__AttributeData::gcd__AttributeData(in_stack_fffffffffffffde0);
  local_228[0] = 0;
  if ((*in_RSI & 1) == 1) {
    COLLADABU::URI::operator=
              ((URI *)in_RDI,(URI *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    local_228[0] = local_228[0] | 1;
  }
  if ((*in_RSI & 2) == 2) {
    local_228[0] = local_228[0] | 2;
  }
  if ((*in_RSI & 4) == 4) {
    COLLADABU::URI::operator=
              ((URI *)in_RDI,(URI *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    local_228[0] = local_228[0] | 4;
  }
  plVar1 = *(long **)((long)&in_RDI->definitionURL + 8);
  bVar2 = (**(code **)(*plVar1 + 0x330))(plVar1,local_228);
  gcd__AttributeData::~gcd__AttributeData(in_RDI);
  return (bool)(bVar2 & 1);
}

Assistant:

bool FormulasLoader15::begin__gcd( const COLLADASaxFWL15::gcd__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__gcd(attributeData));
COLLADASaxFWL::gcd__AttributeData attrData;
attrData.style = attributeData.style;
attrData.xref = attributeData.xref;
attrData.id = attributeData.id;
attrData.encoding = attributeData.encoding;
attrData.unknownAttributes = attributeData.unknownAttributes;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::gcd__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == COLLADASaxFWL15::gcd__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT ) {
    attrData.definitionURL = attributeData.definitionURL;
    attrData.present_attributes |= COLLADASaxFWL::gcd__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::gcd__AttributeData::ATTRIBUTE__CLASS_PRESENT) == COLLADASaxFWL15::gcd__AttributeData::ATTRIBUTE__CLASS_PRESENT ) {
    attrData._class = attributeData._class;
    attrData.present_attributes |= COLLADASaxFWL::gcd__AttributeData::ATTRIBUTE__CLASS_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::gcd__AttributeData::ATTRIBUTE_HREF_PRESENT) == COLLADASaxFWL15::gcd__AttributeData::ATTRIBUTE_HREF_PRESENT ) {
    attrData.href = attributeData.href;
    attrData.present_attributes |= COLLADASaxFWL::gcd__AttributeData::ATTRIBUTE_HREF_PRESENT;
}
return mLoader->begin__gcd(attrData);
}